

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_SUN_triangle_list(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_SUN_triangle_list != 0) {
    glad_glReplacementCodeuiSUN = (PFNGLREPLACEMENTCODEUISUNPROC)(*load)("glReplacementCodeuiSUN");
    glad_glReplacementCodeusSUN = (PFNGLREPLACEMENTCODEUSSUNPROC)(*load)("glReplacementCodeusSUN");
    glad_glReplacementCodeubSUN = (PFNGLREPLACEMENTCODEUBSUNPROC)(*load)("glReplacementCodeubSUN");
    glad_glReplacementCodeuivSUN =
         (PFNGLREPLACEMENTCODEUIVSUNPROC)(*load)("glReplacementCodeuivSUN");
    glad_glReplacementCodeusvSUN =
         (PFNGLREPLACEMENTCODEUSVSUNPROC)(*load)("glReplacementCodeusvSUN");
    glad_glReplacementCodeubvSUN =
         (PFNGLREPLACEMENTCODEUBVSUNPROC)(*load)("glReplacementCodeubvSUN");
    glad_glReplacementCodePointerSUN =
         (PFNGLREPLACEMENTCODEPOINTERSUNPROC)(*load)("glReplacementCodePointerSUN");
  }
  return;
}

Assistant:

static void load_GL_SUN_triangle_list(GLADloadproc load) {
	if(!GLAD_GL_SUN_triangle_list) return;
	glad_glReplacementCodeuiSUN = (PFNGLREPLACEMENTCODEUISUNPROC)load("glReplacementCodeuiSUN");
	glad_glReplacementCodeusSUN = (PFNGLREPLACEMENTCODEUSSUNPROC)load("glReplacementCodeusSUN");
	glad_glReplacementCodeubSUN = (PFNGLREPLACEMENTCODEUBSUNPROC)load("glReplacementCodeubSUN");
	glad_glReplacementCodeuivSUN = (PFNGLREPLACEMENTCODEUIVSUNPROC)load("glReplacementCodeuivSUN");
	glad_glReplacementCodeusvSUN = (PFNGLREPLACEMENTCODEUSVSUNPROC)load("glReplacementCodeusvSUN");
	glad_glReplacementCodeubvSUN = (PFNGLREPLACEMENTCODEUBVSUNPROC)load("glReplacementCodeubvSUN");
	glad_glReplacementCodePointerSUN = (PFNGLREPLACEMENTCODEPOINTERSUNPROC)load("glReplacementCodePointerSUN");
}